

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# light_pcapng.c
# Opt level: O0

void light_pcapng_release(light_pcapng pcapng)

{
  uint32_t uVar1;
  void *__ptr;
  light_pcapng in_RDI;
  uint32_t i;
  light_pcapng *block_pointers;
  uint32_t block_count;
  light_pcapng iter;
  uint local_24;
  light_pcapng local_10;
  
  uVar1 = light_get_block_count(in_RDI);
  __ptr = calloc((ulong)uVar1,8);
  local_24 = 0;
  for (local_10 = in_RDI; local_10 != (light_pcapng)0x0; local_10 = local_10->next_block) {
    *(light_pcapng *)((long)__ptr + (ulong)local_24 * 8) = local_10;
    local_24 = local_24 + 1;
  }
  for (local_24 = 0; local_24 < uVar1; local_24 = local_24 + 1) {
    __free_option((_light_option *)0x10330b);
    free(*(void **)(*(long *)((long)__ptr + (ulong)local_24 * 8) + 8));
    free(*(void **)((long)__ptr + (ulong)local_24 * 8));
  }
  free(__ptr);
  return;
}

Assistant:

void light_pcapng_release(light_pcapng pcapng)
{
	light_pcapng iter = pcapng;
	uint32_t block_count = light_get_block_count(pcapng);
	light_pcapng *block_pointers = calloc(block_count, sizeof(light_pcapng));
	uint32_t i = 0;

	while (iter != NULL) {
		block_pointers[i] = iter;
		i++;
		iter = iter->next_block;
	}

	for (i = 0; i < block_count; ++i) {
		__free_option(block_pointers[i]->options);
		free(block_pointers[i]->block_body);
		free(block_pointers[i]);
	}

	free(block_pointers);
}